

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O0

S2CellId __thiscall S2CellId::parent(S2CellId *this,int level)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  uint64 uVar5;
  uint64 new_lsb;
  S2LogMessage local_70;
  S2LogMessageVoidify local_5a;
  byte local_59;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [20];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_1d;
  int local_1c;
  S2CellId *pSStack_18;
  int level_local;
  S2CellId *this_local;
  
  local_1c = level;
  pSStack_18 = this;
  bVar2 = is_valid(this);
  local_31 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x262,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar4 = S2LogMessage::stream(&local_30);
    poVar4 = std::operator<<(poVar4,"Check failed: is_valid() ");
    S2LogMessageVoidify::operator&(&local_1d,poVar4);
  }
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  local_59 = 0;
  if (local_1c < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x263,kFatal,(ostream *)&std::cerr);
    local_59 = 1;
    poVar4 = S2LogMessage::stream(&local_58);
    poVar4 = std::operator<<(poVar4,"Check failed: (level) >= (0) ");
    S2LogMessageVoidify::operator&(local_45,poVar4);
  }
  iVar1 = local_1c;
  if ((local_59 & 1) == 0) {
    iVar3 = S2CellId::level(this);
    if (iVar3 < iVar1) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                 ,0x264,kFatal,(ostream *)&std::cerr);
      poVar4 = S2LogMessage::stream(&local_70);
      poVar4 = std::operator<<(poVar4,"Check failed: (level) <= (this->level()) ");
      S2LogMessageVoidify::operator&(&local_5a,poVar4);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_70);
    }
    uVar5 = lsb_for_level(local_1c);
    S2CellId((S2CellId *)&this_local,this->id_ & (uVar5 ^ 0xffffffffffffffff) + 1 | uVar5);
    return (S2CellId)(uint64)this_local;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
}

Assistant:

inline S2CellId S2CellId::parent(int level) const {
  S2_DCHECK(is_valid());
  S2_DCHECK_GE(level, 0);
  S2_DCHECK_LE(level, this->level());
  uint64 new_lsb = lsb_for_level(level);
  return S2CellId((id_ & (~new_lsb + 1)) | new_lsb);
}